

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifold_test.cpp
# Opt level: O1

void __thiscall
Manifold_MeshRelationRefinePrecision_Test::TestBody(Manifold_MeshRelationRefinePrecision_Test *this)

{
  pointer lhs;
  pointer puVar1;
  pointer puVar2;
  char *pcVar3;
  initializer_list<MeshSize> __l;
  Manifold csaszar;
  int id;
  AssertionResult gtest_ar;
  MeshGL inGL;
  AssertHelper local_218;
  MeshSize local_210;
  Manifold local_200 [20];
  uint local_1ec;
  undefined1 local_1e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_1e0;
  pointer local_1d8;
  pointer local_168;
  pointer puStack_160;
  pointer local_158;
  MeshGLP<float,_unsigned_int> local_100;
  
  Csaszar();
  manifold::Manifold::Manifold((Manifold *)&local_210,(MeshGLP *)local_1e8);
  WithPositionColors(local_200);
  manifold::Manifold::GetMeshGL((int)&local_100);
  manifold::Manifold::~Manifold(local_200);
  manifold::Manifold::~Manifold((Manifold *)&local_210);
  manifold::MeshGLP<float,_unsigned_int>::~MeshGLP((MeshGLP<float,_unsigned_int> *)local_1e8);
  local_1ec = *local_100.runOriginalID.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
  local_1e8 = (undefined1  [8])0x0;
  pbStack_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1d8 = (pointer)0x0;
  manifold::Manifold::Smooth((MeshGLP *)local_200,(vector *)&local_100);
  if (local_1e8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1e8,(long)local_1d8 - (long)local_1e8);
  }
  manifold::Manifold::RefineToTolerance(0.05);
  manifold::Manifold::operator=(local_200,(Manifold *)local_1e8);
  manifold::Manifold::~Manifold((Manifold *)local_1e8);
  local_210.numVert = 0xa7c;
  local_210.numTri = 0x14f8;
  local_210.numProp = 3;
  local_210.numPropVert = 0xa7c;
  __l._M_len = 1;
  __l._M_array = &local_210;
  std::vector<MeshSize,_std::allocator<MeshSize>_>::vector
            ((vector<MeshSize,_std::allocator<MeshSize>_> *)local_1e8,__l,
             (allocator_type *)&local_218);
  ExpectMeshes(local_200,(vector<MeshSize,_std::allocator<MeshSize>_> *)local_1e8);
  if (local_1e8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1e8,(long)local_1d8 - (long)local_1e8);
  }
  manifold::Manifold::GetMeshGL((int)local_1e8);
  puVar2 = local_158;
  puVar1 = puStack_160;
  lhs = local_168;
  local_168 = (pointer)0x0;
  puStack_160 = (pointer)0x0;
  local_158 = (pointer)0x0;
  manifold::MeshGLP<float,_unsigned_int>::~MeshGLP((MeshGLP<float,_unsigned_int> *)local_1e8);
  local_210._0_8_ = (long)puVar1 - (long)lhs >> 2;
  local_218.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_1e8,"runOriginalID.size()","1",(unsigned_long *)&local_210,
             (int *)&local_218);
  if (local_1e8[0] == (MeshGLP)0x0) {
    testing::Message::Message((Message *)&local_210);
    if (pbStack_1e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (pbStack_1e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x259,pcVar3);
    testing::internal::AssertHelper::operator=(&local_218,(Message *)&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_218);
    if ((long *)local_210._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_210._0_8_ + 8))();
    }
  }
  if (pbStack_1e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1e0,pbStack_1e0);
  }
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_1e8,"runOriginalID[0]","id",lhs,(int *)&local_1ec);
  if (local_1e8[0] == (MeshGLP)0x0) {
    testing::Message::Message((Message *)&local_210);
    if (pbStack_1e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (pbStack_1e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x25a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_218,(Message *)&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_218);
    if ((long *)local_210._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_210._0_8_ + 8))();
    }
  }
  if (pbStack_1e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1e0,pbStack_1e0);
  }
  operator_delete(lhs,(long)puVar2 - (long)lhs);
  manifold::Manifold::~Manifold(local_200);
  manifold::MeshGLP<float,_unsigned_int>::~MeshGLP(&local_100);
  return;
}

Assistant:

TEST(Manifold, MeshRelationRefinePrecision) {
  MeshGL inGL = WithPositionColors(Csaszar()).GetMeshGL();
  const int id = inGL.runOriginalID[0];
  Manifold csaszar = Manifold::Smooth(inGL);

  csaszar = csaszar.RefineToTolerance(0.05);
  ExpectMeshes(csaszar, {{2684, 5368, 3}});
  std::vector<uint32_t> runOriginalID = csaszar.GetMeshGL().runOriginalID;
  EXPECT_EQ(runOriginalID.size(), 1);
  EXPECT_EQ(runOriginalID[0], id);

#ifdef MANIFOLD_EXPORT
  ExportOptions opt;
  opt.mat.roughness = 1;
  opt.mat.colorIdx = 0;
  if (options.exportModels)
    ExportMesh("csaszarSmooth.glb", csaszar.GetMeshGL(), opt);
#endif
}